

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Linear_Object_State_PDU::operator==
          (Linear_Object_State_PDU *this,Linear_Object_State_PDU *Value)

{
  pointer pLVar1;
  KBOOL KVar2;
  pointer Value_00;
  pointer this_00;
  
  KVar2 = Object_State_Header::operator!=
                    (&this->super_Object_State_Header,&Value->super_Object_State_Header);
  if ((((!KVar2) &&
       ((this->super_Object_State_Header).field_0x4b ==
        (Value->super_Object_State_Header).field_0x4b)) &&
      (KVar2 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar2))
     && ((KVar2 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_RecvID,&Value->m_RecvID),
         !KVar2 && (KVar2 = DATA_TYPE::ObjectType::operator!=(&this->m_ObjTyp,&Value->m_ObjTyp),
                   !KVar2)))) {
    this_00 = (this->m_vSegments).
              super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (this->m_vSegments).
             super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vSegments).
               super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pLVar1 - (long)this_00 ==
        (long)(Value->m_vSegments).
              super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pLVar1) {
        return true;
      }
      do {
        KVar2 = DATA_TYPE::LinearSegmentParameter::operator==(this_00,Value_00);
        if (!KVar2) break;
        this_00 = this_00 + 1;
        Value_00 = Value_00 + 1;
      } while (this_00 != pLVar1);
      if (KVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Linear_Object_State_PDU::operator == ( const Linear_Object_State_PDU & Value ) const
{
    if( Object_State_Header::operator  != ( Value ) )             return false;
    if( m_ui8NumSegment                != Value.m_ui8NumSegment ) return false;
    if( m_ReqID                        != Value.m_ReqID )         return false;
    if( m_RecvID                       != Value.m_RecvID )        return false;
    if( m_ObjTyp                       != Value.m_ObjTyp )        return false;
    if( m_vSegments                    != Value.m_vSegments )     return false;
    return true;
}